

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space_mixer.c
# Opt level: O3

void calculate_pitch_shift(space_source *source,space_mixer_data *listener)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  undefined1 auVar10 [16];
  
  fVar1 = listener->doppler_factor;
  if (fVar1 <= 0.0) {
    fVar1 = 1.0;
  }
  else {
    fVar6 = listener->location[0] - source->location[0];
    fVar5 = listener->location[1] - source->location[1];
    fVar8 = listener->location[2] - source->location[2];
    fVar9 = listener->soundspeed;
    fVar7 = SQRT(fVar8 * fVar8 + fVar6 * fVar6 + fVar5 * fVar5);
    auVar10 = insertps(ZEXT416((uint)listener->velocity[1]),source->velocity[1],0x10);
    auVar3 = insertps(ZEXT416((uint)listener->velocity[0]),source->velocity[0],0x10);
    auVar2 = insertps(ZEXT416((uint)listener->velocity[2]),source->velocity[2],0x10);
    auVar4._0_4_ = fVar7 * (auVar2._0_4_ * fVar8 + auVar3._0_4_ * fVar6 + auVar10._0_4_ * fVar5);
    auVar4._4_4_ = fVar7 * (auVar2._4_4_ * fVar8 + auVar3._4_4_ * fVar6 + auVar10._4_4_ * fVar5);
    auVar4._8_4_ = (auVar2._8_4_ * 0.0 + auVar3._8_4_ * 0.0 + auVar10._8_4_ * 0.0) * 0.0;
    auVar4._12_4_ = (auVar2._12_4_ * 0.0 + auVar3._12_4_ * 0.0 + auVar10._12_4_ * 0.0) * 0.0;
    auVar2._4_4_ = fVar9 / fVar1;
    auVar2._0_4_ = fVar9 / fVar1;
    auVar2._8_8_ = 0;
    auVar2 = minps(auVar4,auVar2);
    fVar9 = (fVar9 - fVar1 * auVar2._0_4_) / (fVar9 - fVar1 * auVar2._4_4_);
    fVar1 = 0.5;
    if ((0.5 <= fVar9) && (fVar1 = 2.0, fVar9 < 2.0)) {
      fVar1 = fVar9;
    }
  }
  source->pitch = fVar1;
  return;
}

Assistant:

VECTORIZE static void calculate_pitch_shift(struct space_source *source, struct space_mixer_data *listener){
  if(listener->doppler_factor <= 0.0){
    source->pitch = 1.0;
    return;
  }
  // See OpenAL1.1 specification §3.5.2
  float SL[3] = {listener->location[0] - source->location[0],
                 listener->location[1] - source->location[1],
                 listener->location[2] - source->location[2]};
  float *SV = source->velocity;
  float *LV = listener->velocity;
  float SS = listener->soundspeed;
  float DF = listener->doppler_factor;
  float Mag = vec_length(SL);
  float vls = vec_dot(SL, LV) * Mag;
  float vss = vec_dot(SL, SV) * Mag;
  float SS_DF = SS/DF;
  vss = MIN(vss, SS_DF);
  vls = MIN(vls, SS_DF);
  float pitch = CLAMP(0.5, (SS - DF*vls) / (SS - DF*vss), 2.0);
  source->pitch = pitch;
}